

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

string * __thiscall
PacketBuilder::Get_abi_cxx11_(string *__return_storage_ptr__,PacketBuilder *this)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  array<unsigned_char,_4UL> local_32;
  array<unsigned_char,_2UL> local_2e [2];
  array<unsigned_char,_4UL> length;
  array<unsigned_char,_2UL> id;
  PacketBuilder *this_local;
  string *retdata;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_2e[0] = PacketProcessor::EPID(this->id);
  iVar1 = std::__cxx11::string::length();
  local_32 = PacketProcessor::ENumber(iVar1 + 2 + (int)this->add_size);
  pvVar2 = std::array<unsigned_char,_4UL>::operator[](&local_32,0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
  pvVar2 = std::array<unsigned_char,_4UL>::operator[](&local_32,1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
  pvVar3 = std::array<unsigned_char,_2UL>::operator[](local_2e,0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar3);
  pvVar3 = std::array<unsigned_char,_2UL>::operator[](local_2e,1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&this->data);
  return __return_storage_ptr__;
}

Assistant:

std::string PacketBuilder::Get() const
{
	std::string retdata;
	retdata.reserve(4 + this->data.length());
	std::array<unsigned char, 2> id = PacketProcessor::EPID(this->id);
	std::array<unsigned char, 4> length = PacketProcessor::ENumber(this->data.length() + 2 + this->add_size);

	retdata += length[0];
	retdata += length[1];
	retdata += id[0];
	retdata += id[1];
	retdata += this->data;

	return retdata;
}